

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_RealBox.cpp
# Opt level: O3

void __thiscall amrex::RealBox::RealBox(RealBox *this,Box *bx,Real *dx,Real *base)

{
  uint uVar1;
  int i;
  long lVar2;
  
  uVar1 = (bx->btype).itype;
  lVar2 = 0;
  do {
    this->xlo[lVar2] = (double)(bx->smallend).vect[lVar2] * dx[lVar2] + base[lVar2];
    this->xhi[lVar2] =
         (double)(int)((bx->bigend).vect[lVar2] + (uint)((~uVar1 >> ((uint)lVar2 & 0x1f) & 1) != 0))
         * dx[lVar2] + base[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return;
}

Assistant:

RealBox::RealBox (const Box&  bx,
                  const Real* dx,
                  const Real* base) noexcept
{
    const int* blo = bx.loVect();
    const int* bhi = bx.hiVect();
    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        xlo[i] = base[i] + dx[i]*blo[i];
        int shft = (bx.type(i) == IndexType::CELL ? 1 : 0);
        xhi[i] = base[i] + dx[i]*(bhi[i]+ shft);
    }
}